

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::avx512::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  ulong uVar19;
  long lVar20;
  _func_int *p_Var21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar30;
  vfloat4 a0_2;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM2 [64];
  int iVar39;
  vfloat4 a0_1;
  undefined1 auVar40 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar60;
  float fVar61;
  vfloat4 a1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  RayQueryContext newcontext;
  
  auVar26 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar25 = in_ZMM2._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar1 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  if ((((*(long *)&pGVar2->field_0x58 == 0) &&
       ((uVar19 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                                  (long)pGVar2[1].intersectionFilterN * (ulong)uVar1),
        uVar19 == 0xffffffff ||
        (pGVar2[1].super_RefCount._vptr_RefCount[uVar19] == (_func_int *)0x0)))) ||
      ((ray->mask & pGVar2->mask) == 0)) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    bVar18 = false;
  }
  else {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = uVar1;
    uVar19 = (ulong)prim->primID_;
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar39 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar39 == 0x9134) {
        lVar5 = *plVar4;
        lVar20 = plVar4[2] * uVar19;
        auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar20)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar20)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar20)),0x28);
        auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar20)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar20)),0x1c);
        auVar26 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar20)),0x28);
        auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar20)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar20)),0x28);
        auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar20)),0x1c);
        auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar20)),0x28);
      }
      else if (iVar39 == 0x9234) {
        lVar5 = *plVar4;
        lVar20 = plVar4[2] * uVar19;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(lVar5 + 4 + lVar20);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar20)),_DAT_02060e80,auVar26);
        auVar26 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),_DAT_02060e80,auVar24)
        ;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20)),_DAT_02060e80,
                                          auVar22);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar20);
        auVar25 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar20)),_DAT_02060e80,auVar23
                                    );
      }
      else if (iVar39 == 0xb001) {
        lVar5 = *plVar4;
        lVar20 = plVar4[2] * uVar19;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar20);
        auVar26 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar5 + 8 + lVar20)),0x20);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar20);
        auVar22 = vpermt2ps_avx512vl(auVar34,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + lVar20)));
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar20);
        fVar56 = *(float *)(lVar5 + 0x24 + lVar20);
        fVar60 = *(float *)(lVar5 + 0x28 + lVar20);
        fVar61 = *(float *)(lVar5 + 0x2c + lVar20);
        auVar23 = vpermt2ps_avx512vl(auVar48,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20))
                                    );
        fVar62 = *(float *)(lVar5 + 0x30 + lVar20);
        auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60)),ZEXT416((uint)fVar56),
                                  ZEXT416((uint)fVar56));
        auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
        auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        auVar24 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar25._0_4_));
        fVar49 = auVar24._0_4_;
        fVar49 = fVar49 * 1.5 + fVar49 * fVar49 * fVar49 * auVar25._0_4_ * -0.5;
        auVar25 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar49 * fVar56)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar22,ZEXT416((uint)(fVar49 * fVar60)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar26,ZEXT416((uint)(fVar49 * fVar62)),0x30);
        auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar20)),0x10);
        auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar20)),0x20);
        auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)(fVar61 * fVar49)),0x30);
      }
      else if (iVar39 == 0x9244) {
        lVar5 = *plVar4;
        lVar20 = plVar4[2] * uVar19;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar20))->v;
        auVar26 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar20);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar20))->
                        v;
        auVar25 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar20);
      }
      auVar23 = vshufps_avx(auVar25,auVar25,0xff);
      auVar24 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar29 = vshufps_avx(auVar26,auVar26,0xff);
      auVar34 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar22 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar22 = vblendps_avx(auVar22,auVar26,4);
      fVar53 = auVar24._0_4_;
      auVar48 = vfmadd213ss_fma(auVar23,auVar23,ZEXT416((uint)(fVar53 * fVar53)));
      auVar48 = vfnmadd231ss_fma(auVar48,auVar29,auVar29);
      auVar35 = vfnmadd231ss_fma(auVar48,auVar34,auVar34);
      fVar49 = auVar23._0_4_;
      auVar27 = ZEXT416((uint)(auVar34._0_4_ * fVar49));
      auVar48 = vfmadd213ss_fma(auVar29,auVar24,auVar27);
      fVar56 = auVar48._0_4_ + auVar48._0_4_;
      auVar43 = ZEXT416((uint)(auVar29._0_4_ * fVar49));
      auVar48 = vfmsub213ss_fma(auVar34,auVar24,auVar43);
      fVar60 = auVar48._0_4_ + auVar48._0_4_;
      auVar48 = vfmsub231ss_fma(auVar27,auVar24,auVar29);
      fVar61 = auVar48._0_4_ + auVar48._0_4_;
      auVar48 = vfmsub231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),auVar23,auVar23);
      auVar23 = vfmadd213ss_avx512f(auVar29,auVar29,auVar48);
      auVar27 = vfnmadd231ss_avx512f(auVar23,auVar34,auVar34);
      auVar23 = vfmadd213ss_avx512f(auVar34,auVar29,ZEXT416((uint)(fVar53 * fVar49)));
      auVar28 = vaddss_avx512f(auVar23,auVar23);
      auVar23 = vfmadd213ss_fma(auVar24,auVar34,auVar43);
      fVar62 = auVar23._0_4_ + auVar23._0_4_;
      auVar23 = vfmsub231ss_fma(ZEXT416((uint)(fVar53 * fVar49)),auVar29,auVar34);
      fVar49 = auVar23._0_4_ + auVar23._0_4_;
      auVar23 = vfnmadd231ss_fma(auVar48,auVar29,auVar29);
      auVar34 = vfmadd231ss_fma(auVar23,auVar34,auVar34);
      uVar30 = auVar35._0_4_;
      auVar57._4_4_ = uVar30;
      auVar57._0_4_ = uVar30;
      auVar57._8_4_ = uVar30;
      auVar57._12_4_ = uVar30;
      auVar63._4_4_ = fVar56;
      auVar63._0_4_ = fVar56;
      auVar63._8_4_ = fVar56;
      auVar63._12_4_ = fVar56;
      auVar65._0_4_ = fVar60 * 0.0;
      auVar65._4_4_ = fVar60 * 0.0;
      auVar65._8_4_ = fVar60 * 1.0;
      auVar65._12_4_ = fVar60 * 0.0;
      auVar48 = ZEXT816(0x3f80000000000000);
      auVar23 = vfmadd231ps_fma(auVar65,auVar48,auVar63);
      auVar35 = SUB6416(ZEXT464(0x3f800000),0);
      auVar24 = vfmadd231ps_fma(auVar23,auVar35,auVar57);
      auVar58._4_4_ = fVar61;
      auVar58._0_4_ = fVar61;
      auVar58._8_4_ = fVar61;
      auVar58._12_4_ = fVar61;
      auVar23 = vbroadcastss_avx512vl(auVar27);
      auVar29 = vbroadcastss_avx512vl(auVar28);
      auVar64._0_4_ = auVar29._0_4_ * 0.0;
      auVar64._4_4_ = auVar29._4_4_ * 0.0;
      auVar64._8_4_ = auVar29._8_4_ * 1.0;
      auVar64._12_4_ = auVar29._12_4_ * 0.0;
      auVar23 = vfmadd231ps_fma(auVar64,auVar48,auVar23);
      auVar29 = vfmadd231ps_fma(auVar23,auVar35,auVar58);
      auVar54._4_4_ = fVar62;
      auVar54._0_4_ = fVar62;
      auVar54._8_4_ = fVar62;
      auVar54._12_4_ = fVar62;
      auVar51._4_4_ = fVar49;
      auVar51._0_4_ = fVar49;
      auVar51._8_4_ = fVar49;
      auVar51._12_4_ = fVar49;
      fVar56 = auVar34._0_4_;
      auVar59._0_4_ = fVar56 * 0.0;
      auVar59._4_4_ = fVar56 * 0.0;
      auVar59._8_4_ = fVar56 * 1.0;
      auVar59._12_4_ = fVar56 * 0.0;
      auVar23 = vfmadd231ps_fma(auVar59,auVar48,auVar51);
      auVar23 = vfmadd231ps_fma(auVar23,auVar35,auVar54);
      auVar35._0_4_ = a0.field_0._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      fVar56 = auVar23._0_4_;
      auVar52._0_4_ = fVar56 * 0.0;
      fVar60 = auVar23._4_4_;
      auVar52._4_4_ = fVar60 * 0.0;
      fVar61 = auVar23._8_4_;
      auVar52._8_4_ = fVar61 * 0.0;
      fVar62 = auVar23._12_4_;
      auVar52._12_4_ = fVar62 * 0.0;
      auVar23 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar29,auVar52);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar23,auVar24,auVar35);
      uVar30 = auVar26._0_4_;
      auVar55._4_4_ = uVar30;
      auVar55._0_4_ = uVar30;
      auVar55._8_4_ = uVar30;
      auVar55._12_4_ = uVar30;
      auVar26 = vshufps_avx(auVar26,auVar26,0x55);
      auVar26 = vfmadd213ps_fma(auVar26,auVar29,auVar52);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar26,auVar24,auVar55);
      iVar39 = a0_1.field_0._0_4_;
      auVar43._4_4_ = iVar39;
      auVar43._0_4_ = iVar39;
      auVar43._8_4_ = iVar39;
      auVar43._12_4_ = iVar39;
      auVar26 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar28._0_4_ = fVar56 * auVar23._0_4_;
      auVar28._4_4_ = fVar60 * auVar23._4_4_;
      auVar28._8_4_ = fVar61 * auVar23._8_4_;
      auVar28._12_4_ = fVar62 * auVar23._12_4_;
      auVar26 = vfmadd231ps_fma(auVar28,auVar29,auVar26);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar26,auVar24,auVar43);
      uVar30 = auVar25._0_4_;
      auVar44._4_4_ = uVar30;
      auVar44._0_4_ = uVar30;
      auVar44._8_4_ = uVar30;
      auVar44._12_4_ = uVar30;
      auVar26 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar27._0_4_ = fVar56 * auVar25._0_4_;
      auVar27._4_4_ = fVar60 * auVar25._4_4_;
      auVar27._8_4_ = fVar61 * auVar25._8_4_;
      auVar27._12_4_ = fVar62 * auVar25._12_4_;
      auVar25 = vfmadd231ps_fma(auVar27,auVar29,auVar26);
      auVar26 = vfmadd231ps_fma(auVar25,auVar24,auVar44);
      auVar25._0_4_ = auVar22._0_4_ + 0.0 + auVar26._0_4_;
      auVar25._4_4_ = auVar22._4_4_ + 0.0 + auVar26._4_4_;
      auVar25._8_4_ = auVar22._8_4_ + 0.0 + auVar26._8_4_;
      auVar25._12_4_ = auVar22._12_4_ + 0.0 + auVar26._12_4_;
    }
    else if (iVar39 == 0x9134) {
      lVar5 = *plVar4;
      lVar20 = plVar4[2] * uVar19;
      auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar20)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar20)),0x1c);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar20)),0x28);
      auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar20)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar20)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar20)),0x28);
      auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar20)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar20)),0x28);
      auVar25 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar20)),0x1c);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar20)),0x28);
    }
    else if (iVar39 == 0x9234) {
      lVar5 = *plVar4;
      lVar20 = plVar4[2] * uVar19;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 4 + lVar20);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar20);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar20)),_DAT_02060e80,auVar36);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),_DAT_02060e80,auVar40
                                     );
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar20);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20)),_DAT_02060e80,
                                        auVar37);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar20);
      auVar25 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar20)),_DAT_02060e80,auVar45);
    }
    else if (iVar39 == 0xb001) {
      lVar5 = *plVar4;
      lVar20 = plVar4[2] * uVar19;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar20);
      auVar26 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar5 + 8 + lVar20)),0x20);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar20);
      auVar22 = vpermt2ps_avx512vl(auVar32,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + lVar20)));
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar20);
      fVar56 = *(float *)(lVar5 + 0x24 + lVar20);
      fVar60 = *(float *)(lVar5 + 0x28 + lVar20);
      fVar61 = *(float *)(lVar5 + 0x2c + lVar20);
      auVar23 = vpermt2ps_avx512vl(auVar46,_DAT_02060e90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar20)));
      fVar62 = *(float *)(lVar5 + 0x30 + lVar20);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60)),ZEXT416((uint)fVar56),
                                ZEXT416((uint)fVar56));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
      auVar24 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar25._0_4_));
      fVar49 = auVar24._0_4_;
      fVar49 = fVar49 * 1.5 + fVar49 * fVar49 * fVar49 * auVar25._0_4_ * -0.5;
      auVar25 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar49 * fVar56)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar22,ZEXT416((uint)(fVar49 * fVar60)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar26,ZEXT416((uint)(fVar49 * fVar62)),0x30);
      auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar20)),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar20)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar26,ZEXT416((uint)(fVar61 * fVar49)),0x30);
    }
    else if (iVar39 == 0x9244) {
      lVar5 = *plVar4;
      lVar20 = plVar4[2] * uVar19;
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar20))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar20))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar20))->v;
      auVar25 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar20);
    }
    auVar26 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar22 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar50._0_4_ = a0_1.field_0._0_4_ * auVar22._0_4_;
    auVar50._4_4_ = a0_1.field_0._4_4_ * auVar22._4_4_;
    auVar50._8_4_ = a0_1.field_0._8_4_ * auVar22._8_4_;
    auVar50._12_4_ = a0_1.field_0._12_4_ * auVar22._12_4_;
    auVar29 = vfmsub231ps_fma(auVar50,(undefined1  [16])a0.field_0,auVar26);
    auVar23 = vshufps_avx(auVar29,auVar29,0xc9);
    auVar24 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar41._0_4_ = a0_2.field_0._0_4_ * auVar26._0_4_;
    auVar41._4_4_ = a0_2.field_0._4_4_ * auVar26._4_4_;
    auVar41._8_4_ = a0_2.field_0._8_4_ * auVar26._8_4_;
    auVar41._12_4_ = a0_2.field_0._12_4_ * auVar26._12_4_;
    auVar34 = vfmsub231ps_fma(auVar41,auVar24,(undefined1  [16])a0_1.field_0);
    auVar33._0_4_ = auVar24._0_4_ * a0.field_0._0_4_;
    auVar33._4_4_ = auVar24._4_4_ * a0.field_0._4_4_;
    auVar33._8_4_ = auVar24._8_4_ * a0.field_0._8_4_;
    auVar33._12_4_ = auVar24._12_4_ * a0.field_0._12_4_;
    auVar24 = vfmsub231ps_fma(auVar33,(undefined1  [16])a0_2.field_0,auVar22);
    auVar26 = vshufps_avx(auVar24,auVar24,0xc9);
    auVar22 = vunpcklps_avx(auVar23,auVar26);
    auVar24 = vunpcklps_avx(auVar29,auVar24);
    auVar26 = vinsertps_avx(auVar34,auVar34,0x4a);
    auVar24 = vunpcklps_avx(auVar24,ZEXT416(auVar34._0_4_));
    auVar29 = vunpcklps_avx(auVar22,auVar26);
    auVar22 = vunpckhps_avx(auVar22,auVar26);
    auVar26 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar23,0x7f);
    uVar30 = auVar26._0_4_;
    auVar47._4_4_ = uVar30;
    auVar47._0_4_ = uVar30;
    auVar47._8_4_ = uVar30;
    auVar47._12_4_ = uVar30;
    auVar26 = vdivps_avx(auVar29,auVar47);
    auVar22 = vdivps_avx(auVar22,auVar47);
    auVar23 = vdivps_avx(auVar24,auVar47);
    uVar30 = auVar25._0_4_;
    auVar42._4_4_ = uVar30;
    auVar42._0_4_ = uVar30;
    auVar42._8_4_ = uVar30;
    auVar42._12_4_ = uVar30;
    auVar24 = vshufps_avx(auVar25,auVar25,0x55);
    auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
    auVar38._0_4_ = auVar25._0_4_ * auVar23._0_4_;
    auVar38._4_4_ = auVar25._4_4_ * auVar23._4_4_;
    auVar38._8_4_ = auVar25._8_4_ * auVar23._8_4_;
    auVar38._12_4_ = auVar25._12_4_ * auVar23._12_4_;
    auVar25 = vfmadd231ps_fma(auVar38,auVar22,auVar24);
    auVar25 = vfmadd231ps_fma(auVar25,auVar26,auVar42);
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar25 = vxorps_avx512vl(auVar25,auVar7);
    p_Var21 = *(_func_int **)&pGVar2->field_0x58;
    if (p_Var21 == (_func_int *)0x0) {
      p_Var21 = pGVar2[1].super_RefCount._vptr_RefCount
                [*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                          uVar19 * (long)pGVar2[1].intersectionFilterN)];
    }
    uVar16 = *(undefined8 *)&(ray->org).field_0;
    uVar17 = *(undefined8 *)((long)&(ray->org).field_0 + 8);
    uVar14 = *(undefined8 *)&(ray->dir).field_0;
    uVar15 = *(undefined8 *)((long)&(ray->dir).field_0 + 8);
    uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar8._4_4_ = uVar30;
    auVar8._0_4_ = uVar30;
    auVar8._8_4_ = uVar30;
    auVar8._12_4_ = uVar30;
    auVar25 = vfmadd231ps_avx512vl(auVar25,auVar23,auVar8);
    uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar9._4_4_ = uVar30;
    auVar9._0_4_ = uVar30;
    auVar9._8_4_ = uVar30;
    auVar9._12_4_ = uVar30;
    auVar25 = vfmadd231ps_avx512vl(auVar25,auVar22,auVar9);
    uVar30 = *(undefined4 *)&(ray->org).field_0;
    auVar10._4_4_ = uVar30;
    auVar10._0_4_ = uVar30;
    auVar10._8_4_ = uVar30;
    auVar10._12_4_ = uVar30;
    auVar25 = vfmadd231ps_avx512vl(auVar25,auVar26,auVar10);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar25,ZEXT416((uint)(ray->org).field_0.m128[3]),0x30);
    (ray->org).field_0 = aVar6;
    uVar30 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar11._4_4_ = uVar30;
    auVar11._0_4_ = uVar30;
    auVar11._8_4_ = uVar30;
    auVar11._12_4_ = uVar30;
    auVar25 = vmulps_avx512vl(auVar23,auVar11);
    uVar30 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar12._4_4_ = uVar30;
    auVar12._0_4_ = uVar30;
    auVar12._8_4_ = uVar30;
    auVar12._12_4_ = uVar30;
    auVar25 = vfmadd231ps_avx512vl(auVar25,auVar22,auVar12);
    uVar30 = *(undefined4 *)&(ray->dir).field_0;
    auVar13._4_4_ = uVar30;
    auVar13._0_4_ = uVar30;
    auVar13._8_4_ = uVar30;
    auVar13._12_4_ = uVar30;
    auVar25 = vfmadd231ps_avx512vl(auVar25,auVar26,auVar13);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar25,ZEXT416((uint)(ray->dir).field_0.m128[3]),0x30);
    (ray->dir).field_0 = aVar6;
    (**(code **)(p_Var21 + 0x80))(p_Var21 + 0x58,ray);
    *(undefined8 *)&(ray->org).field_0 = uVar16;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uVar17;
    *(undefined8 *)&(ray->dir).field_0 = uVar14;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar15;
    bVar18 = ray->tfar < 0.0;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return bVar18;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }